

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slot.hpp
# Opt level: O0

Slot<void_(int),_std::function<void_(int)>_> * __thiscall
sig::Slot<void(int),std::function<void(int)>>::
track<void(),sig::Optional_last_value<void>,int,std::less<int>,std::function<void()>,std::mutex>
          (Slot<void(int),std::function<void(int)>> *this,
          Signal<void_(),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_()>,_std::mutex>
          *sig)

{
  Signal<void_(),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_()>,_std::mutex>
  local_38;
  weak_ptr<void> local_28;
  Signal<void_(),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_()>,_std::mutex>
  *local_18;
  Signal<void_(),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_()>,_std::mutex>
  *sig_local;
  Slot<void_(int),_std::function<void_(int)>_> *this_local;
  
  local_18 = sig;
  sig_local = (Signal<void_(),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_()>,_std::mutex>
               *)this;
  Signal<void_(),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_()>,_std::mutex>
  ::lock_impl_as_void(&local_38);
  std::weak_ptr<void>::weak_ptr<void,void>(&local_28,(shared_ptr<void> *)&local_38);
  std::vector<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_>::push_back
            ((vector<std::weak_ptr<void>,_std::allocator<std::weak_ptr<void>_>_> *)(this + 8),
             &local_28);
  std::weak_ptr<void>::~weak_ptr(&local_28);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)&local_38);
  return (Slot<void_(int),_std::function<void_(int)>_> *)this;
}

Assistant:

Slot& track(const Signal<T, U, V, W, X, Y>& sig) {
        tracked_ptrs_.push_back(sig.lock_impl_as_void());
        return *this;
    }